

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string * __thiscall
MountPoint::translate(string *__return_storage_ptr__,MountPoint *this,string *path)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *path_local;
  MountPoint *this_local;
  
  local_20 = path;
  path_local = (string *)this;
  this_local = (MountPoint *)__return_storage_ptr__;
  iVar2 = std::__cxx11::string::compare
                    ((ulong)path,0,(char *)(this->root).len_,(ulong)(this->root).str_);
  if (iVar2 == 0) {
    std::__cxx11::string::erase((ulong)local_20,0);
    bVar1 = std::operator==(local_20,"..");
    if ((bVar1) ||
       ((uVar3 = std::__cxx11::string::length(), 2 < uVar3 &&
        (iVar2 = std::__cxx11::string::compare((ulong)local_20,0,(char *)0x3), iVar2 == 0)))) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      StringPiece::AsString_abi_cxx11_(&local_60,&this->mountPoint);
      std::operator+(&local_40,&local_60,"/");
      std::operator+(__return_storage_ptr__,&local_40,local_20);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string translate(string& path) const {
    // path must be sub dir of root
    if (path.compare(0, root.len_, root.str_, root.len_) != 0) {
      return string();
    }
    path.erase(0, root.len_);
    if (path == ".." || (path.length() > 2 && path.compare(0, 3, "../") == 0)) {
      return string();
    }
    return mountPoint.AsString() + "/" + path;
  }